

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

size_t gguf_get_meta_size(gguf_context *ctx)

{
  size_type sVar1;
  vector<signed_char,_std::allocator<signed_char>_> *in_RDI;
  gguf_context *unaff_retaddr;
  vector<signed_char,_std::allocator<signed_char>_> buf;
  vector<signed_char,_std::allocator<signed_char>_> *in_stack_ffffffffffffffd0;
  undefined1 in_stack_fffffffffffffff7;
  
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)0x192278);
  gguf_write_to_buf(unaff_retaddr,in_RDI,(bool)in_stack_fffffffffffffff7);
  sVar1 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                    ((vector<signed_char,_std::allocator<signed_char>_> *)&stack0xffffffffffffffe0);
  std::vector<signed_char,_std::allocator<signed_char>_>::~vector(in_stack_ffffffffffffffd0);
  return sVar1;
}

Assistant:

size_t gguf_get_meta_size(const struct gguf_context * ctx) {
    // only return size
    std::vector<int8_t> buf;
    gguf_write_to_buf(ctx, buf, /*only_meta =*/ true);
    return buf.size();
}